

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

uint64_t wid_mask_un_shifted(stagewise_poly *poly,uint64_t wid)

{
  uint64_t uVar1;
  stagewise_poly *in_RSI;
  parameters *in_stack_ffffffffffffffd8;
  
  parameters::mask(in_stack_ffffffffffffffd8);
  uVar1 = stride_un_shift(in_RSI,(uint64_t)in_stack_ffffffffffffffd8);
  return uVar1;
}

Assistant:

inline uint64_t wid_mask_un_shifted(const stagewise_poly &poly, uint64_t wid)
{
  return stride_un_shift(poly, wid & poly.all->weights.mask());
}